

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char_const(&)[13],char_const*&,char,char_const*,char_const(&)[7],char_const*>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char (*args_2) [13],
          char **args_3,char *args_4,char **args_5,char (*args_6) [7],char **args_7)

{
  ostringstream *in_RCX;
  Exception *in_RDX;
  char **unaff_RBX;
  ostream *in_RSI;
  char (*in_RDI) [13];
  char *in_R8;
  int *in_R9;
  char (*unaff_retaddr) [7];
  char **in_stack_00000008;
  char **in_stack_ffffffffffffffb8;
  char (*args_3_00) [13];
  
  args_3_00 = in_RDI;
  std::operator<<(in_RSI,*(char **)in_RDX);
  SetWhat<char,int&,char_const(&)[13],char_const*&,char,char_const*,char_const(&)[7],char_const*>
            (in_RDX,in_RCX,in_R8,in_R9,in_RDI,in_stack_ffffffffffffffb8,*args_3_00,unaff_RBX,
             unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }